

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
               (TestResults *results,float (*expected) [3] [3],float (*actual) [3] [3],int rows,
               int columns,float *tolerance,TestDetails *details)

{
  bool bVar1;
  ostream *poVar2;
  char *failure;
  int local_1ec;
  int local_1e8;
  int actualColumn;
  int actualRow;
  int expectedColumn;
  int expectedRow;
  undefined1 local_1d0 [8];
  MemoryOutStream stream;
  int i;
  bool equal;
  float *tolerance_local;
  int columns_local;
  int rows_local;
  float (*actual_local) [3] [3];
  float (*expected_local) [3] [3];
  TestResults *results_local;
  
  stream._407_1_ = 1;
  for (stream._400_4_ = 0; (int)stream._400_4_ < rows; stream._400_4_ = stream._400_4_ + 1) {
    bVar1 = ArrayAreClose<float[3],float[3],float>
                      (*expected + (int)stream._400_4_,*actual + (int)stream._400_4_,columns,
                       tolerance);
    stream._407_1_ = (stream._407_1_ & 1 & bVar1) != 0;
  }
  if (stream._407_1_ == '\0') {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1d0);
    std::operator<<((ostream *)local_1d0,"Expected [ ");
    for (actualRow = 0; actualRow < rows; actualRow = actualRow + 1) {
      std::operator<<((ostream *)local_1d0,"[ ");
      for (actualColumn = 0; actualColumn < columns; actualColumn = actualColumn + 1) {
        poVar2 = (ostream *)std::ostream::operator<<(local_1d0,(*expected)[actualRow][actualColumn])
        ;
        std::operator<<(poVar2," ");
      }
      std::operator<<((ostream *)local_1d0,"] ");
    }
    poVar2 = std::operator<<((ostream *)local_1d0,"] +/- ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*tolerance);
    std::operator<<(poVar2," but was [ ");
    for (local_1e8 = 0; local_1e8 < rows; local_1e8 = local_1e8 + 1) {
      std::operator<<((ostream *)local_1d0,"[ ");
      for (local_1ec = 0; local_1ec < columns; local_1ec = local_1ec + 1) {
        poVar2 = (ostream *)std::ostream::operator<<(local_1d0,(*actual)[local_1e8][local_1ec]);
        std::operator<<(poVar2," ");
      }
      std::operator<<((ostream *)local_1d0,"] ");
    }
    std::operator<<((ostream *)local_1d0,"]");
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1d0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1d0);
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}